

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrRenderer.cpp
# Opt level: O2

ClipVec4 * __thiscall
rr::anon_unknown_19::cliputil::ComponentPlane<-1,_1>::getLineIntersectionPoint
          (ClipVec4 *__return_storage_ptr__,ComponentPlane<_1,_1> *this,ClipVec4 *v0,ClipVec4 *v1)

{
  Vector<double,_4> *y;
  Vector<double,_4> *pVVar1;
  ClipFloat a;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double a_00;
  ClipVec4 clippedV1;
  ClipVec4 clippedV0;
  Vector<double,_4> local_70;
  Vector<double,_4> local_50;
  
  pVVar1 = &local_50;
  tcu::mix<4>(&local_50,v0,v1,
              (v0->m_data[3] - v0->m_data[1]) /
              ((v1->m_data[1] - v0->m_data[1]) - (v1->m_data[3] - v0->m_data[3])));
  a = clipLineSegmentEnd((ComponentPlane<_1,_1> *)pVVar1,v0,v1);
  tcu::mix<4>(&local_70,v0,v1,a);
  (*(this->super_ClipVolumePlane)._vptr_ClipVolumePlane[1])(this,&local_50,&local_70);
  if (extraout_XMM0_Qa <= 0.5) {
    pVVar1 = &local_50;
    y = &local_70;
    a_00 = extraout_XMM0_Qa;
  }
  else {
    pVVar1 = &local_70;
    y = &local_50;
    (*(this->super_ClipVolumePlane)._vptr_ClipVolumePlane[1])(this,pVVar1,y);
    a_00 = extraout_XMM0_Qa_00;
  }
  tcu::mix<4>(__return_storage_ptr__,pVVar1,y,a_00);
  return __return_storage_ptr__;
}

Assistant:

ClipVec4 ComponentPlane<Sign, CompNdx>::getLineIntersectionPoint (const ClipVec4& v0, const ClipVec4& v1) const
{
	// A point on line might be far away, causing clipping ratio (clipLineSegmentEnd) to become extremely close to 1.0
	// even if the another point is not on the plane. Prevent clipping ratio from saturating by using points on line
	// that are (nearly) on this and (nearly) on the opposite plane.

	const ClipVec4	clippedV0	= tcu::mix(v0, v1, ComponentPlane<+1, CompNdx>().clipLineSegmentEnd(v0, v1));
	const ClipVec4	clippedV1	= tcu::mix(v0, v1, ComponentPlane<-1, CompNdx>().clipLineSegmentEnd(v0, v1));
	const ClipFloat	clipRatio	= clipLineSegmentEnd(clippedV0, clippedV1);

	// Find intersection point of line from v0 to v1 and the current plane. Avoid ratios near 1.0
	if (clipRatio <= (ClipFloat)0.5)
		return tcu::mix(clippedV0, clippedV1, clipRatio);
	else
	{
		const ClipFloat complementClipRatio = clipLineSegmentEnd(clippedV1, clippedV0);
		return tcu::mix(clippedV1, clippedV0, complementClipRatio);
	}
}